

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<const_kj::ReadableDirectory_*>::dispose
          (ArrayBuilder<const_kj::ReadableDirectory_*> *this)

{
  ReadableDirectory **firstElement;
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar1;
  ReadableDirectory **ppRVar2;
  ReadableDirectory **endCopy;
  ReadableDirectory **posCopy;
  ReadableDirectory **ptrCopy;
  ArrayBuilder<const_kj::ReadableDirectory_*> *this_local;
  
  firstElement = this->ptr;
  ppRVar1 = this->pos;
  ppRVar2 = this->endPtr;
  if (firstElement != (ReadableDirectory **)0x0) {
    this->ptr = (ReadableDirectory **)0x0;
    this->pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
    this->endPtr = (ReadableDirectory **)0x0;
    ArrayDisposer::dispose<kj::ReadableDirectory_const*>
              (this->disposer,firstElement,(long)ppRVar1 - (long)firstElement >> 3,
               (long)ppRVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }